

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O0

bool crnlib::create_compressed_texture
               (crn_comp_params *params,vector<unsigned_char> *comp_data,
               uint32 *pActual_quality_level,float *pActual_bitrate)

{
  bool bVar1;
  uint uVar2;
  float *in_RCX;
  uint *in_RDX;
  vector<unsigned_char> *in_RSI;
  void *in_RDI;
  float fVar3;
  double dVar4;
  float bitrate;
  int quality;
  float bracket_high_bitrate;
  float bracket_low_bitrate;
  int bracket_high;
  int bracket_low;
  int trial_quality;
  bool force_binary_search;
  uint iter_count;
  float highest_bitrate;
  int i;
  float cached_bitrates [256];
  int high_quality;
  int low_quality;
  uint cMaxIterations;
  int best_quality_level;
  float best_bitrate;
  int cNumQualityLevels;
  int cHighestQuality;
  int cLowestQuality;
  itexture_comp *pTexture_comp;
  crn_comp_params local_params;
  undefined4 in_stack_fffffffffffff7e8;
  crn_file_type in_stack_fffffffffffff7ec;
  vector<unsigned_char> *in_stack_fffffffffffff7f0;
  vector<unsigned_char> *this;
  undefined4 in_stack_fffffffffffff7f8;
  undefined1 grow_hint;
  uint in_stack_fffffffffffff7fc;
  vector<unsigned_char> *in_stack_fffffffffffff800;
  float local_7f4;
  uint local_7f0;
  float local_7ec;
  float local_7e8;
  int local_7e4;
  uint local_7e0;
  uint local_7dc;
  byte local_7d5;
  uint local_7d4;
  float local_7d0;
  int local_7cc;
  float afStack_7c8 [30];
  uint local_3c8;
  uint local_3c4;
  uint local_3bc;
  float local_3b8;
  itexture_comp *local_3a8;
  crn_comp_params local_3a0;
  float *local_28;
  uint *local_20;
  vector<unsigned_char> *local_18;
  void *local_10;
  bool local_1;
  
  grow_hint = (undefined1)((uint)in_stack_fffffffffffff7f8 >> 0x18);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(&local_3a0,in_RDI,0x378);
  bVar1 = pixel_format_helpers::is_crn_format_non_srgb(local_3a0.m_format);
  if ((bVar1) && (bVar1 = crn_comp_params::get_flag(&local_3a0,cCRNCompFlagPerceptual), bVar1)) {
    console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
    crn_comp_params::set_flag(&local_3a0,cCRNCompFlagPerceptual,false);
  }
  if (local_20 != (uint *)0x0) {
    *local_20 = 0;
  }
  if (local_28 != (float *)0x0) {
    *local_28 = 0.0;
  }
  vector<unsigned_char>::resize(in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,(bool)grow_hint)
  ;
  local_3a8 = create_texture_comp(in_stack_fffffffffffff7ec);
  if (local_3a8 == (itexture_comp *)0x0) {
    local_1 = false;
  }
  else {
    uVar2 = (*local_3a8->_vptr_itexture_comp[3])(local_3a8,&local_3a0);
    if ((uVar2 & 1) == 0) {
      crnlib_delete<crnlib::itexture_comp>((itexture_comp *)0x1bb2b7);
      local_1 = false;
    }
    else if (((local_3a0.m_target_bitrate <= 0.0) || (local_3a0.m_format == cCRNFmtDXT3)) ||
            ((local_3a0.m_file_type == cCRNFileTypeCRN && ((local_3a0.m_flags & 0x40) != 0)))) {
      if ((local_3a0.m_file_type == cCRNFileTypeCRN) ||
         ((local_3a0.m_file_type == cCRNFileTypeDDS && (local_3a0.m_quality_level < 0xff)))) {
        console::info("Compressing using quality level %i",(ulong)local_3a0.m_quality_level);
      }
      if (local_3a0.m_format == cCRNFmtDXT3) {
        if (local_3a0.m_file_type == cCRNFileTypeCRN) {
          console::warning("CRN format doesn\'t support DXT3");
        }
        else if ((local_3a0.m_file_type == cCRNFileTypeDDS) && (local_3a0.m_quality_level < 0xff)) {
          console::warning("Clustered DDS compressor doesn\'t support DXT3");
        }
      }
      uVar2 = (*local_3a8->_vptr_itexture_comp[4])(local_3a8,&local_3a0,local_28);
      if ((uVar2 & 1) == 0) {
        crnlib_delete<crnlib::itexture_comp>((itexture_comp *)0x1bb3b0);
        local_1 = false;
      }
      else {
        (*local_3a8->_vptr_itexture_comp[7])();
        vector<unsigned_char>::swap
                  (in_stack_fffffffffffff7f0,
                   (vector<unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        if ((local_20 != (uint *)0x0) && (local_3a0.m_target_bitrate <= 0.0)) {
          *local_20 = local_3a0.m_quality_level;
        }
        crnlib_delete<crnlib::itexture_comp>((itexture_comp *)0x1bb424);
        local_1 = true;
      }
    }
    else {
      local_3b8 = 1e+10;
      local_3bc = 0xffffffff;
      do {
        local_3c4 = 0;
        local_3c8 = 0xff;
        for (local_7cc = 0; local_7cc < 0x100; local_7cc = local_7cc + 1) {
          afStack_7c8[local_7cc] = -1.0;
        }
        local_7d0 = 0.0;
        local_7d4 = 0;
        local_7d5 = 0;
        while ((int)local_3c4 <= (int)local_3c8) {
          if ((*(uint *)((long)local_10 + 0x20) & 0x80000000) != 0) {
            console::debug("Quality level bracket: [%u, %u]",(ulong)local_3c4,(ulong)local_3c8);
          }
          local_7dc = (int)(local_3c4 + local_3c8) / 2;
          if ((local_7d4 != 0) && (uVar2 = local_7dc, (local_7d5 & 1) == 0)) {
            while (local_7e0 = uVar2,
                  (afStack_7c8[(int)local_7e0] <= 0.0 && afStack_7c8[(int)local_7e0] != 0.0) &&
                  0 < (int)local_7e0) {
              uVar2 = local_7e0 - 1;
            }
            if (0.0 < afStack_7c8[(int)local_7e0] || afStack_7c8[(int)local_7e0] == 0.0) {
              local_7e4 = local_7dc + 1;
              if (local_7e4 < 0x100) {
                for (; (afStack_7c8[local_7e4] <= 0.0 && afStack_7c8[local_7e4] != 0.0) &&
                       local_7e4 < 0xff; local_7e4 = local_7e4 + 1) {
                }
                if (0.0 <= afStack_7c8[local_7e4]) {
                  local_7e8 = afStack_7c8[(int)local_7e0];
                  local_7ec = afStack_7c8[local_7e4];
                  if ((((local_7e8 < local_7ec) && (local_7e8 < local_3a0.m_target_bitrate)) &&
                      (local_3a0.m_target_bitrate <= local_7ec)) &&
                     ((local_7f0 = local_3c4 +
                                   (int)(((local_3a0.m_target_bitrate - local_7e8) *
                                         (float)(int)(local_3c8 - local_3c4)) /
                                        (local_7ec - local_7e8)), (int)local_3c4 <= (int)local_7f0
                      && ((int)local_7f0 <= (int)local_3c8)))) {
                    local_7dc = local_7f0;
                  }
                }
              }
            }
            else {
              fVar3 = math::lerp<float,float>((float)(int)local_3c4,(float)(int)local_3c8,0.33);
              local_7dc = (uint)fVar3;
            }
          }
          console::info("Compressing to quality level %u",(ulong)local_7dc);
          local_7f4 = 0.0;
          local_3a0.m_quality_level = local_7dc;
          uVar2 = (*local_3a8->_vptr_itexture_comp[4])(local_3a8,&local_3a0,&local_7f4);
          if ((uVar2 & 1) == 0) {
            crnlib_delete<crnlib::itexture_comp>((itexture_comp *)0x1bb753);
            return false;
          }
          afStack_7c8[(int)local_7dc] = local_7f4;
          local_7d0 = math::maximum<float>(local_7d0,local_7f4);
          console::info((char *)(double)local_7f4,"\nTried quality level %u, bpp: %3.3f",
                        (ulong)local_7dc);
          if (((int)local_3bc < 0) ||
             ((local_7f4 <= local_3a0.m_target_bitrate && (local_3a0.m_target_bitrate < local_3b8)))
             ) {
LAB_001bb844:
            fVar3 = local_7f4;
            local_3b8 = local_7f4;
            this = local_18;
            (*local_3a8->_vptr_itexture_comp[7])();
            vector<unsigned_char>::swap
                      (this,(vector<unsigned_char> *)
                            CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
            local_3bc = local_7dc;
            if ((*(uint *)((long)local_10 + 0x20) & 0x80000000) != 0) {
              console::debug("Choose new best quality level");
            }
            if ((fVar3 <= local_3a0.m_target_bitrate) &&
               (dVar4 = std::fabs((double)(ulong)(uint)(fVar3 - local_3a0.m_target_bitrate)),
               SUB84(dVar4,0) < 0.005)) break;
          }
          else if ((local_7f4 <= local_3a0.m_target_bitrate) ||
                  (local_3a0.m_target_bitrate < local_3b8)) {
            dVar4 = std::fabs((double)(ulong)(uint)(local_7f4 - local_3a0.m_target_bitrate));
            fVar3 = SUB84(dVar4,0);
            dVar4 = std::fabs((double)(ulong)(uint)(local_3b8 - local_3a0.m_target_bitrate));
            if (fVar3 < SUB84(dVar4,0)) goto LAB_001bb844;
          }
          if (local_7f4 <= local_3a0.m_target_bitrate) {
            local_3c4 = local_7dc + 1;
          }
          else {
            local_3c8 = local_7dc - 1;
          }
          local_7d4 = local_7d4 + 1;
          if (8 < local_7d4) {
            local_7d5 = 1;
          }
        }
        if ((((local_3a0.m_flags & 2) == 0) || (local_3a0.m_target_bitrate <= local_7d0)) ||
           (dVar4 = std::fabs((double)(ulong)(uint)(local_3b8 - local_3a0.m_target_bitrate)),
           SUB84(dVar4,0) < 0.005)) {
          crnlib_delete<crnlib::itexture_comp>((itexture_comp *)0x1bba0e);
          if ((int)local_3bc < 0) {
            return false;
          }
          if (local_20 != (uint *)0x0) {
            *local_20 = local_3bc;
          }
          if (local_28 != (float *)0x0) {
            *local_28 = local_3b8;
          }
          console::printf("Selected quality level %u bpp: %f",(double)local_3b8,(ulong)local_3bc);
          return true;
        }
        console::info(
                     "Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search."
                     );
        local_3a0.m_flags = local_3a0.m_flags & 0xfffffffd;
        crnlib_delete<crnlib::itexture_comp>((itexture_comp *)0x1bb9b0);
        local_3a8 = create_texture_comp(in_stack_fffffffffffff7ec);
        uVar2 = (*local_3a8->_vptr_itexture_comp[3])(local_3a8,&local_3a0);
      } while ((uVar2 & 1) != 0);
      crnlib_delete<crnlib::itexture_comp>((itexture_comp *)0x1bb9eb);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate) {
  crn_comp_params local_params(params);

  if (pixel_format_helpers::is_crn_format_non_srgb(local_params.m_format)) {
    if (local_params.get_flag(cCRNCompFlagPerceptual)) {
      console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");

      // Destination compressed pixel format is swizzled or not RGB at all, so be sure perceptual colorspace metrics are disabled.
      local_params.set_flag(cCRNCompFlagPerceptual, false);
    }
  }

  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  comp_data.resize(0);

  itexture_comp* pTexture_comp = create_texture_comp(local_params.m_file_type);
  if (!pTexture_comp)
    return false;

  if (!pTexture_comp->compress_init(local_params)) {
    crnlib_delete(pTexture_comp);
    return false;
  }

  if ((local_params.m_target_bitrate <= 0.0f) ||
      (local_params.m_format == cCRNFmtDXT3) ||
      ((local_params.m_file_type == cCRNFileTypeCRN) && ((local_params.m_flags & cCRNCompFlagManualPaletteSizes) != 0))) {
    if ((local_params.m_file_type == cCRNFileTypeCRN) ||
        ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))) {
      console::info("Compressing using quality level %i", local_params.m_quality_level);
    }
    if (local_params.m_format == cCRNFmtDXT3) {
      if (local_params.m_file_type == cCRNFileTypeCRN)
        console::warning("CRN format doesn't support DXT3");
      else if ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))
        console::warning("Clustered DDS compressor doesn't support DXT3");
    }
    if (!pTexture_comp->compress_pass(local_params, pActual_bitrate)) {
      crnlib_delete(pTexture_comp);
      return false;
    }

    comp_data.swap(pTexture_comp->get_comp_data());

    if ((pActual_quality_level) && (local_params.m_target_bitrate <= 0.0))
      *pActual_quality_level = local_params.m_quality_level;

    crnlib_delete(pTexture_comp);
    return true;
  }

  // Interpolative search to find closest quality level to target bitrate.
  const int cLowestQuality = 0;
  const int cHighestQuality = cCRNMaxQualityLevel;
  const int cNumQualityLevels = cHighestQuality - cLowestQuality + 1;

  float best_bitrate = 1e+10f;
  int best_quality_level = -1;
  const uint cMaxIterations = 8;

  for (;;) {
    int low_quality = cLowestQuality;
    int high_quality = cHighestQuality;

    float cached_bitrates[cNumQualityLevels];
    for (int i = 0; i < cNumQualityLevels; i++)
      cached_bitrates[i] = -1.0f;

    float highest_bitrate = 0.0f;

    uint iter_count = 0;
    bool force_binary_search = false;

    while (low_quality <= high_quality) {
      if (params.m_flags & cCRNCompFlagDebugging) {
        console::debug("Quality level bracket: [%u, %u]", low_quality, high_quality);
      }

      int trial_quality = (low_quality + high_quality) / 2;

      if ((iter_count) && (!force_binary_search)) {
        int bracket_low = trial_quality;
        while ((cached_bitrates[bracket_low] < 0) && (bracket_low > cLowestQuality))
          bracket_low--;

        if (cached_bitrates[bracket_low] < 0)
          trial_quality = static_cast<int>(math::lerp<float>((float)low_quality, (float)high_quality, .33f));
        else {
          int bracket_high = trial_quality + 1;
          if (bracket_high <= cHighestQuality) {
            while ((cached_bitrates[bracket_high] < 0) && (bracket_high < cHighestQuality))
              bracket_high++;

            if (cached_bitrates[bracket_high] >= 0) {
              float bracket_low_bitrate = cached_bitrates[bracket_low];
              float bracket_high_bitrate = cached_bitrates[bracket_high];

              if ((bracket_low_bitrate < bracket_high_bitrate) &&
                  (bracket_low_bitrate < local_params.m_target_bitrate) &&
                  (bracket_high_bitrate >= local_params.m_target_bitrate)) {
                int quality = low_quality + static_cast<int>(((local_params.m_target_bitrate - bracket_low_bitrate) * (high_quality - low_quality)) / (bracket_high_bitrate - bracket_low_bitrate));

                if ((quality >= low_quality) && (quality <= high_quality)) {
                  trial_quality = quality;
                }
              }
            }
          }
        }
      }

      console::info("Compressing to quality level %u", trial_quality);

      float bitrate = 0.0f;

      local_params.m_quality_level = trial_quality;

      if (!pTexture_comp->compress_pass(local_params, &bitrate)) {
        crnlib_delete(pTexture_comp);
        return false;
      }

      cached_bitrates[trial_quality] = bitrate;

      highest_bitrate = math::maximum(highest_bitrate, bitrate);

      console::info("\nTried quality level %u, bpp: %3.3f", trial_quality, bitrate);

      if ((best_quality_level < 0) ||
          ((bitrate <= local_params.m_target_bitrate) && (best_bitrate > local_params.m_target_bitrate)) ||
          (((bitrate <= local_params.m_target_bitrate) || (best_bitrate > local_params.m_target_bitrate)) && (fabs(bitrate - local_params.m_target_bitrate) < fabs(best_bitrate - local_params.m_target_bitrate)))) {
        best_bitrate = bitrate;
        comp_data.swap(pTexture_comp->get_comp_data());
        best_quality_level = trial_quality;
        if (params.m_flags & cCRNCompFlagDebugging) {
          console::debug("Choose new best quality level");
        }

        if ((best_bitrate <= local_params.m_target_bitrate) && (fabs(best_bitrate - local_params.m_target_bitrate) < .005f))
          break;
      }

      if (bitrate > local_params.m_target_bitrate)
        high_quality = trial_quality - 1;
      else
        low_quality = trial_quality + 1;

      iter_count++;
      if (iter_count > cMaxIterations) {
        force_binary_search = true;
      }
    }

    if (((local_params.m_flags & cCRNCompFlagHierarchical) != 0) &&
        (highest_bitrate < local_params.m_target_bitrate) &&
        (fabs(best_bitrate - local_params.m_target_bitrate) >= .005f)) {
      console::info("Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search.");

      local_params.m_flags &= ~cCRNCompFlagHierarchical;

      crnlib_delete(pTexture_comp);
      pTexture_comp = create_texture_comp(local_params.m_file_type);

      if (!pTexture_comp->compress_init(local_params)) {
        crnlib_delete(pTexture_comp);
        return false;
      }
    } else
      break;
  }

  crnlib_delete(pTexture_comp);
  pTexture_comp = NULL;

  if (best_quality_level < 0)
    return false;

  if (pActual_quality_level)
    *pActual_quality_level = best_quality_level;
  if (pActual_bitrate)
    *pActual_bitrate = best_bitrate;

  console::printf("Selected quality level %u bpp: %f", best_quality_level, best_bitrate);

  return true;
}